

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdCelsiusBlendEquation::emulate_mthd(MthdCelsiusBlendEquation *this)

{
  pgraph_state *state;
  uint uVar1;
  uint uVar2;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val - 0x8006;
  if (uVar1 < 6) {
    uVar2 = *(uint *)(&DAT_00290e24 + (ulong)uVar1 * 4);
    uVar1 = *(uint *)(&DAT_00290e3c + (ulong)uVar1 * 4);
  }
  else {
    uVar1 = 0;
    uVar2 = 1;
  }
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4
          | uVar2;
  if (uVar2 != 0) {
    MthdTest::warn((MthdTest *)this,uVar2);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend &
            0xfffffff8 | uVar1;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_blend = uVar1;
    pgraph_celsius_icmd(state,0x20,uVar1,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		uint32_t rv = 0;
		switch (val) {
			case 0x8006:
				rv = 0x2;
				break;
			case 0x8007:
				rv = 0x3;
				break;
			case 0x8008:
				rv = 0x4;
				break;
			case 0x800a:
				rv = 0x0;
				break;
			case 0x800b:
				rv = 0x1;
				break;
			default:
				err |= 1;
				break;
		}
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				insrt(exp.bundle_blend, 0, 3, rv);
				pgraph_celsius_icmd(&exp, 0x20, exp.bundle_blend, true);
			}
		}
	}